

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

int set_scaling_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  ushort uVar8;
  Am_Point_List local_b8;
  Am_Point_List local_a8;
  Am_Object local_98;
  Am_Object local_90;
  float local_88;
  float local_84;
  float yscale;
  float xscale;
  Am_Point_List local_70;
  Am_Point_List local_60;
  undefined1 local_50 [8];
  Am_Point_List arrow_pl;
  undefined1 local_30 [8];
  Am_Point_List pl;
  Am_Feature_Vector feat;
  int view_height;
  int view_width;
  Am_Object *self_local;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0x5540,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get(0x5540,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  uVar8 = (ushort)self;
  pAVar6 = (Am_Value *)Am_Object::Get(uVar8,(ulong)(ushort)EXAMPLE_FEATURES);
  Am_Feature_Vector::Am_Feature_Vector((Am_Feature_Vector *)&pl.item,pAVar6);
  Am_Point_List::Am_Point_List((Am_Point_List *)local_30);
  Am_Point_List::Am_Point_List((Am_Point_List *)local_50);
  bVar1 = Am_Feature_Vector::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Feature_Vector::Points();
    Am_Point_List::operator=((Am_Point_List *)local_30,(Am_Point_List *)&local_60);
    Am_Point_List::~Am_Point_List(&local_60);
  }
  Am_Point_List::Am_Point_List((Am_Point_List *)&yscale,(Am_Point_List *)local_30);
  compute_arrowhead(&local_70);
  Am_Point_List::operator=((Am_Point_List *)local_50,(Am_Point_List *)&local_70);
  Am_Point_List::~Am_Point_List(&local_70);
  Am_Point_List::~Am_Point_List((Am_Point_List *)&yscale);
  bVar1 = Am_Point_List::Valid();
  if ((bVar1 & 1) != 0) {
    pAVar5 = (Am_Value *)Am_Object::Get(uVar8,0x66);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    local_84 = (float)iVar4 / (float)iVar2;
    pAVar5 = (Am_Value *)Am_Object::Get(uVar8,0x67);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    local_88 = (float)iVar2 / (float)iVar3;
    Am_Point_List::Scale(local_84,local_88,(int)local_30,0,false);
    Am_Point_List::Scale(local_84,local_88,(int)local_50,0,false);
  }
  Am_Object::Get_Object((ushort)&local_90,(ulong)self);
  pAVar7 = Am_Point_List::operator_cast_to_Am_Wrapper_((Am_Point_List *)local_30);
  Am_Object::Set((ushort)&local_90,(Am_Wrapper *)0xb2,(ulong)pAVar7);
  Am_Object::~Am_Object(&local_90);
  Am_Object::Get_Object((ushort)&local_98,(ulong)self);
  Am_Point_List::Am_Point_List(&local_b8,(Am_Point_List *)local_30);
  compute_arrowhead(&local_a8);
  pAVar7 = Am_Point_List::operator_cast_to_Am_Wrapper_(&local_a8);
  Am_Object::Set((ushort)&local_98,(Am_Wrapper *)0xb2,(ulong)pAVar7);
  Am_Point_List::~Am_Point_List(&local_a8);
  Am_Point_List::~Am_Point_List(&local_b8);
  Am_Object::~Am_Object(&local_98);
  Am_Point_List::~Am_Point_List((Am_Point_List *)local_50);
  Am_Point_List::~Am_Point_List((Am_Point_List *)local_30);
  Am_Feature_Vector::~Am_Feature_Vector((Am_Feature_Vector *)&pl.item);
  return 1;
}

Assistant:

Am_Define_Formula(int, set_scaling)
{
  int view_width = gesture_frame.Get(Am_WIDTH);
  int view_height = gesture_frame.Get(Am_HEIGHT);

  Am_Feature_Vector feat = self.Get(EXAMPLE_FEATURES);
  Am_Point_List pl, arrow_pl;

  if (feat.Valid())
    pl = feat.Points();

  arrow_pl = compute_arrowhead(pl);

  if (pl.Valid()) {
    float xscale = (float)(int)self.Get(Am_WIDTH) / view_width;
    float yscale = (float)(int)self.Get(Am_HEIGHT) / view_height;

    pl.Scale(xscale, yscale);
    arrow_pl.Scale(xscale, yscale);
  }

  self.Get_Object(EXAMPLE_STROKE).Set(Am_POINT_LIST, pl);
  self.Get_Object(EXAMPLE_ARROW).Set(Am_POINT_LIST, compute_arrowhead(pl));
  return 1;
}